

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack.c
# Opt level: O2

void ts_stack_record_summary(Stack *self,StackVersion version,uint max_depth)

{
  anon_struct_16_3_8b926706_for_iterators *self_00;
  TSStateId TVar1;
  uint uVar2;
  uint32_t uVar3;
  StackNode *pSVar4;
  StackIterator *pSVar5;
  StackNode *pSVar6;
  Subtree *pSVar7;
  undefined8 uVar8;
  uint32_t uVar9;
  _Bool _Var10;
  ushort uVar11;
  uint uVar12;
  StackSummary *self_01;
  long lVar13;
  long lVar14;
  SubtreeArray *pSVar15;
  Subtree self_02;
  uint uVar16;
  ulong uVar17;
  StackIterator *pSVar18;
  StackSummaryEntry *pSVar19;
  ulong uVar20;
  StackNode *pSVar21;
  _Bool *p_Var22;
  byte local_a5;
  uint local_a4;
  uint local_a0;
  
  self_01 = (StackSummary *)ts_malloc(0x10);
  self_01->contents = (StackSummaryEntry *)0x0;
  *(undefined8 *)&self_01->size = 0;
  (self->slices).size = 0;
  (self->iterators).size = 0;
  if ((self->heads).size <= version) {
    __assert_fail("(uint32_t)version < (&self->heads)->size",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                  ,0x118,
                  "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)");
  }
  self_00 = &self->iterators;
  pSVar4 = (self->heads).contents[version].node;
  array__grow((VoidArray *)self_00,0x20);
  pSVar18 = (self->iterators).contents;
  uVar16 = (self->iterators).size;
  (self->iterators).size = uVar16 + 1;
  pSVar18[uVar16].node = pSVar4;
  pSVar15 = &pSVar18[uVar16].subtrees;
  pSVar15->contents = (Subtree *)0x0;
  pSVar15->size = 0;
  pSVar15->capacity = 0;
  pSVar18[uVar16].subtree_count = 0;
  pSVar18[uVar16].is_pending = true;
  pSVar19 = (StackSummaryEntry *)0x0;
  local_a0 = 0;
  do {
    local_a4 = (self->iterators).size;
    if (local_a4 == 0) {
      (self->heads).contents[version].summary = self_01;
      return;
    }
    uVar17 = 0;
    while (uVar16 = (uint)uVar17, uVar16 < local_a4) {
      pSVar18 = self_00->contents;
      uVar12 = pSVar18[uVar17].subtree_count;
      if (max_depth < uVar12) {
LAB_00117fe0:
        ts_subtree_array_delete(self->subtree_pool,&pSVar18[uVar17].subtrees);
        array__erase((VoidArray *)self_00,0x20,uVar16);
        local_a4 = local_a4 - 1;
      }
      else {
        pSVar4 = pSVar18[uVar17].node;
        TVar1 = pSVar4->state;
        lVar14 = (ulong)local_a0 * 0x14;
        do {
          lVar13 = lVar14;
          lVar14 = lVar13 + -0x14;
          if ((lVar14 == -0x14) || (uVar2 = *(uint *)((long)pSVar19 + lVar13 + -8), uVar2 < uVar12))
          {
            array__grow((VoidArray *)self_01,0x14);
            pSVar19 = self_01->contents;
            uVar2 = self_01->size;
            local_a0 = uVar2 + 1;
            self_01->size = local_a0;
            pSVar21 = pSVar18[uVar17].node;
            uVar3 = (pSVar21->position).bytes;
            uVar9 = (pSVar21->position).extent.row;
            pSVar19[uVar2].position.extent.column = (pSVar21->position).extent.column;
            pSVar19[uVar2].position.bytes = uVar3;
            pSVar19[uVar2].position.extent.row = uVar9;
            pSVar19[uVar2].depth = uVar12;
            pSVar19[uVar2].state = TVar1;
            break;
          }
        } while ((uVar2 != uVar12) || (*(TSStateId *)((long)pSVar19 + lVar13 + -4) != TVar1));
        uVar11 = pSVar4->link_count;
        if (uVar11 == 0) goto LAB_00117fe0;
        p_Var22 = &pSVar4->links[1].is_pending;
        for (uVar20 = 1; uVar20 <= uVar11; uVar20 = uVar20 + 1) {
          if (uVar20 == uVar11) {
            pSVar21 = pSVar4->links[0].node;
            self_02 = pSVar4->links[0].subtree;
            local_a5 = pSVar4->links[0].is_pending;
            pSVar18 = self_00->contents + uVar17;
LAB_00117f86:
            pSVar18->node = pSVar21;
            if (self_02.ptr == (SubtreeHeapData *)0x0) {
              pSVar18->subtree_count = pSVar18->subtree_count + 1;
            }
            else {
              _Var10 = ts_subtree_extra(self_02);
              if ((_Var10) ||
                 (pSVar18->subtree_count = pSVar18->subtree_count + 1, (local_a5 & 1) != 0))
              goto LAB_00117fb8;
            }
            pSVar18->is_pending = false;
          }
          else if ((self->iterators).size < 0x40) {
            pSVar21 = ((StackLink *)(p_Var22 + -0x10))->node;
            self_02 = *(Subtree *)(p_Var22 + -8);
            local_a5 = *p_Var22;
            pSVar5 = (self->iterators).contents;
            pSVar18 = pSVar5 + uVar17;
            pSVar6 = pSVar18->node;
            pSVar7 = (pSVar18->subtrees).contents;
            pSVar5 = pSVar5 + uVar17;
            uVar3 = (pSVar5->subtrees).size;
            uVar9 = (pSVar5->subtrees).capacity;
            uVar8 = *(undefined8 *)(&(pSVar5->subtrees).size + 2);
            array__grow((VoidArray *)self_00,0x20);
            pSVar18 = (self->iterators).contents;
            uVar12 = (self->iterators).size;
            (self->iterators).size = uVar12 + 1;
            pSVar5 = pSVar18 + uVar12;
            (pSVar5->subtrees).size = uVar3;
            (pSVar5->subtrees).capacity = uVar9;
            *(undefined8 *)(&(pSVar5->subtrees).size + 2) = uVar8;
            pSVar18 = pSVar18 + uVar12;
            pSVar18->node = pSVar6;
            (pSVar18->subtrees).contents = pSVar7;
            uVar3 = (self->iterators).size;
            if (uVar3 == 0) {
              __assert_fail("(uint32_t)(&self->iterators)->size - 1 < (&self->iterators)->size",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Aerijo[P]latex-language-server/third_party/tree-sitter/src/runtime/stack.c"
                            ,0x151,
                            "StackSliceArray stack__iter(Stack *, StackVersion, StackCallback, void *, int)"
                           );
            }
            uVar12 = uVar3 - 1;
            pSVar18 = self_00->contents + uVar12;
            pSVar15 = &self_00->contents[uVar12].subtrees;
            ts_subtree_array_copy(*pSVar15,pSVar15);
            goto LAB_00117f86;
          }
LAB_00117fb8:
          uVar11 = pSVar4->link_count;
          p_Var22 = p_Var22 + 0x18;
        }
        uVar17 = (ulong)(uVar16 + 1);
      }
    }
  } while( true );
}

Assistant:

void ts_stack_record_summary(Stack *self, StackVersion version, unsigned max_depth) {
  SummarizeStackSession session = {
    .summary = ts_malloc(sizeof(StackSummary)),
    .max_depth = max_depth
  };
  array_init(session.summary);
  stack__iter(self, version, summarize_stack_callback, &session, -1);
  self->heads.contents[version].summary = session.summary;
}